

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDVertexTag ON_SubD::VertexTagFromUnsigned(uint vertex_tag_as_unsigned)

{
  if (vertex_tag_as_unsigned < 5) {
    return (ON_SubDVertexTag)vertex_tag_as_unsigned;
  }
  ON_SubDIncrementErrorCount();
  return Unset;
}

Assistant:

ON_SubDVertexTag ON_SubD::VertexTagFromUnsigned(
  unsigned int vertex_tag_as_unsigned
  )
{
  switch (vertex_tag_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDVertexTag::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDVertexTag::Smooth);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDVertexTag::Crease);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDVertexTag::Corner);
  ON_ENUM_FROM_UNSIGNED_CASE(ON_SubDVertexTag::Dart);
  }
  return ON_SUBD_RETURN_ERROR(ON_SubDVertexTag::Unset);
}